

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O0

void __thiscall tinyxml2::XMLAttribute::~XMLAttribute(XMLAttribute *this)

{
  XMLAttribute *in_RDI;
  
  ~XMLAttribute(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~XMLAttribute()	{}